

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O3

void StringFormatter<unsigned_char_const&>::format<unsigned_char_const>
               (ostream *os,char *fmt,uchar *value)

{
  ostream *poVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  uchar *puVar5;
  long lVar6;
  void *pvVar7;
  runtime_error *this;
  char *pcVar8;
  bool bVar9;
  uint uVar10;
  ostream oVar11;
  char *__nptr;
  char *pcVar12;
  char *q;
  char local_63;
  char local_62;
  uchar local_61;
  undefined8 local_60;
  long local_58;
  char *local_50;
  uchar *local_48;
  long local_40;
  char *local_38;
  
  local_48 = value;
  while( true ) {
    for (; cVar2 = *fmt, cVar2 != '%'; fmt = fmt + 1) {
      if (cVar2 == '\0') {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"too many arguments for format");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_62 = cVar2;
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_62,1);
    }
    cVar2 = fmt[1];
    if (cVar2 != '%') break;
    fmt = fmt + 2;
    local_63 = '%';
    std::__ostream_insert<char,std::char_traits<char>>(os,&local_63,1);
  }
  pcVar8 = fmt + (cVar2 == '-');
  cVar3 = fmt[(ulong)(cVar2 == '-') + 1];
  bVar9 = cVar3 == ' ' || cVar3 == '+';
  __nptr = pcVar8 + (ulong)bVar9 + 1;
  if (*__nptr == ',') {
    __nptr = pcVar8 + (ulong)bVar9 + 2;
    oVar11 = (ostream)0x2c;
  }
  else {
    oVar11 = (ostream)0x20;
    if (*__nptr == '0') {
      __nptr = pcVar8 + (ulong)bVar9 + 2;
      oVar11 = (ostream)0x30;
    }
  }
  local_40 = strtol(__nptr,&local_38,10);
  local_50 = local_38;
  if (*local_38 == '.') {
    pcVar12 = local_38 + 1;
    lVar6 = strtol(pcVar12,&local_38,10);
    local_60 = CONCAT71((int7)((ulong)pcVar8 >> 8),pcVar12 != local_38);
    local_58 = (long)(int)lVar6;
  }
  else {
    local_58 = 0;
    local_60 = 0;
  }
  do {
    pcVar8 = local_38;
    cVar4 = *pcVar8;
    pvVar7 = memchr("qhlLzjt",(int)cVar4,8);
    local_38 = pcVar8 + 1;
  } while (pvVar7 != (void *)0x0);
  pcVar12 = pcVar8;
  if ((cVar4 == 'I') && (pcVar12 = pcVar8 + 1, (byte)(pcVar8[2] | 2U) == 0x36)) {
    pcVar12 = pcVar8 + 3;
  }
  cVar4 = *pcVar12;
  StringFormatter<const_unsigned_char_&>::applytype(os,cVar4);
  lVar6 = *(long *)os;
  if (cVar3 == '+') {
    os[*(long *)(lVar6 + -0x18) + 0x19] = (ostream)((byte)os[*(long *)(lVar6 + -0x18) + 0x19] | 8);
    uVar10 = 0x10;
    if (cVar2 == '-') {
LAB_0010c817:
      uVar10 = 0x20;
    }
    *(uint *)(os + *(long *)(lVar6 + -0x18) + 0x18) =
         *(uint *)(os + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffff4f | uVar10;
  }
  else {
    os[*(long *)(lVar6 + -0x18) + 0x19] =
         (ostream)((byte)os[*(long *)(lVar6 + -0x18) + 0x19] & 0xf7);
    if (cVar2 == '-') goto LAB_0010c817;
  }
  if (__nptr == local_50) {
    *(undefined8 *)(os + *(long *)(lVar6 + -0x18) + 0x10) = 0;
  }
  else {
    *(long *)(os + *(long *)(lVar6 + -0x18) + 0x10) = (long)(int)local_40;
    if (cVar2 != '-' && cVar3 != '+') {
      *(uint *)(os + *(long *)(lVar6 + -0x18) + 0x18) =
           *(uint *)(os + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffff4f | 0x80;
    }
  }
  if ((char)local_60 != '\0') {
    *(long *)(os + *(long *)(lVar6 + -0x18) + 8) = local_58;
  }
  poVar1 = os + *(long *)(lVar6 + -0x18);
  if (os[*(long *)(lVar6 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar1);
    poVar1[0xe1] = (ostream)0x1;
  }
  puVar5 = local_48;
  poVar1[0xe0] = oVar11;
  if (cVar4 == 'c') {
    bVar9 = StringFormatter<const_unsigned_char_&>::output_wchar<unsigned_char>(os,local_48);
    if (bVar9) goto LAB_0010c92e;
    pvVar7 = memchr("iduoxX",(int)cVar4,7);
  }
  else {
    pvVar7 = memchr("iduoxX",(int)cVar4,7);
    puVar5 = local_48;
  }
  if (pvVar7 == (void *)0x0) {
    local_61 = *puVar5;
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_61,1);
  }
  else {
    std::ostream::_M_insert<unsigned_long>((ulong)os);
  }
LAB_0010c92e:
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = 0;
  StringFormatter<const_unsigned_char_&>::format(os,pcVar12 + (cVar4 != '\0'));
  return;
}

Assistant:

static void format(std::ostream& os, const char *fmt, T& value, FARGS&&...args) 
    {
        bool used_value = false;
        const char *p= fmt;
        while (*p) {
            if (*p=='%') {
                p++;
                if (*p=='%') {
                    os << *p++;
                }
                else {

                    // '-'  means left adjust
                    bool leftadjust= false;
                    if (*p=='-') {
                        p++;
                        leftadjust= true;
                    }
                    bool forcesign= false;
                    //bool blankforpositive= false;
                    if (*p=='+') {
                        p++;
                        forcesign= true;
                    }
                    else if (*p==' ') {
                        p++;
                        //blankforpositive= true;  // <-- todo
                    }
                    
                    // '0' means pad with zero
                    // ',' is useful for arrays
                    char padchar= ' ';

                    if (*p=='0') { p++; padchar='0'; }
                    else if (*p==',') { p++; padchar=','; }

                    // width specification
                    char *q;
                    // todo: support '*'  : take size from argumentlist.
                    // todo: support '#'  : adds 0, 0x, 0X prefix to oct/hex numbers -> 'showbase'
                    int width= strtol(p, &q, 10);
                    bool havewidth= p!=q;
                    p= q;

                    // precision after '.'
                    int precision= 0;
                    bool haveprecision= false;
                    if (*p=='.') {
                        p++;
                        // todo: support '*'
                        precision= strtol(p, &q, 10);
                        haveprecision= p!=q;
                        p= q;
                    }

                    // ignore argument size field
                    while (std::strchr("qhlLzjt", *p))
                        p++;
                    if (*p=='I') {
                        // microsoft I64 specifier
                        p++;
                        if (p[1]=='6' || p[1]=='4') {
                            p+=2;
                        }
                    }

                    char type= 0;
                    if (*p)
                        type= *p++;

                    // use formatting
                    applytype(os, type);
                    if (forcesign)
                        os << std::showpos;
                    else
                        os << std::noshowpos;

                    if (leftadjust)
                        os << std::left;
                    else if (forcesign) {
                        // exception: when forcing display of sign
                        // we need to use 'internal fill'
                        os << std::internal;
                    }

                    if (havewidth) {
                        os.width(width);
                        if (!leftadjust && !forcesign)
                            os << std::right;
                    }
                    else {
                        os.width(0);
                    }
                    // todo: support precision(truncate) for strings
                    if (haveprecision)
                        os.precision(precision);
                    os.fill(padchar);

                    if (type=='c' && output_wchar(os, value))
                    {
                        // nop
                    }
                    else if (type=='p' && output_pointer(os, value))
                    {
                        // nop
                    }
                    else if (type=='b' && output_hex_data(os, value))
                    {
                        // nop
                    }
                    else if (std::strchr("iduoxX", type) && output_int(os, value))
                    {
                        // nop
                    }
                    else if (type=='s' && output_null(os, value))
                    {
                        // nop
                    }
                    else if (output_using_operator(os, value))
                    {
                        // when type ~ float/double : '[AEFGaefg]' || type == 's' || other outputs failed.
                        // nop
                    }
                    else {
                        os << "<?>";
                    }

                    // TODO: improve float formatting

                    // reset precision
                    os.precision(0);

                    used_value = true;

                    format(os, p, args...);
                    return;
                }
            }
            else {
                os << *p++;
            }
        }

        if (!used_value)
            throw std::runtime_error("too many arguments for format");
    }